

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O0

void addCategoricalCrossEntropyLossWithSoftmaxAndSGDOptimizer(Model *m,char *softmaxInputName)

{
  NeuralNetworkLayer *pNVar1;
  set<long,_std::less<long>,_std::allocator<long>_> local_c8;
  set<long,_std::less<long>,_std::allocator<long>_> local_98;
  set<long,_std::less<long>,_std::allocator<long>_> local_58;
  NeuralNetworkLayer *local_28;
  NeuralNetworkLayer *softmaxLayer;
  NeuralNetwork *neuralNets;
  char *softmaxInputName_local;
  Model *m_local;
  
  neuralNets = (NeuralNetwork *)softmaxInputName;
  softmaxInputName_local = (char *)m;
  softmaxLayer = (NeuralNetworkLayer *)CoreML::Specification::Model::mutable_neuralnetwork(m);
  local_28 = CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)softmaxLayer);
  CoreML::Specification::NeuralNetworkLayer::set_name(local_28,"softmax");
  CoreML::Specification::NeuralNetworkLayer::add_input(local_28,(char *)neuralNets);
  CoreML::Specification::NeuralNetworkLayer::add_output(local_28,"softmax_out");
  CoreML::Specification::NeuralNetworkLayer::mutable_softmax(local_28);
  addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetwork>
            ((Model *)softmaxInputName_local,(NeuralNetwork *)softmaxLayer,
             "cross_entropy_loss_layer","softmax_out","target");
  addLearningRate<CoreML::Specification::NeuralNetwork>
            ((NeuralNetwork *)softmaxLayer,kSgdOptimizer,0.699999988079071,0.0,1.0);
  pNVar1 = softmaxLayer;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_58._M_t._M_impl._0_8_ = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_58);
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>
            ((NeuralNetwork *)pNVar1,kSgdOptimizer,10,5,100,&local_58);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_58);
  pNVar1 = softmaxLayer;
  local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_98._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_98._M_t._M_impl._0_8_ = 0;
  local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_98);
  addEpochs<CoreML::Specification::NeuralNetwork>((NeuralNetwork *)pNVar1,100,1,100,&local_98);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_98);
  pNVar1 = softmaxLayer;
  local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_c8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_c8._M_t._M_impl._0_8_ = 0;
  local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_c8);
  addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
            ((NeuralNetwork *)pNVar1,0x7e3,0,0x7e3,&local_c8);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_c8);
  return;
}

Assistant:

void addCategoricalCrossEntropyLossWithSoftmaxAndSGDOptimizer(Specification::Model& m, const char *softmaxInputName) {
    
    auto neuralNets = m.mutable_neuralnetwork();

    // set a softmax layer
    auto softmaxLayer = neuralNets->add_layers();
    softmaxLayer->set_name("softmax");
    softmaxLayer->add_input(softmaxInputName);
    softmaxLayer->add_output("softmax_out");
    softmaxLayer->mutable_softmax();

    addCategoricalCrossEntropyLoss(m, neuralNets, "cross_entropy_loss_layer", "softmax_out", "target");
    
    addLearningRate(neuralNets, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNets, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNets, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNets, 2019, 0, 2019, std::set<int64_t>());
}